

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_session.cpp
# Opt level: O0

void __thiscall bidfx_public_api::impl::ApiSession::ApiSession(ApiSession *this)

{
  PricingSession *this_00;
  Pricing *local_70;
  ApiSession *this_local;
  
  Session::Session(&this->super_Session);
  (this->super_Session).super_UserInfo._vptr_UserInfo =
       (_func_int **)&PTR_GetHost_abi_cxx11__003a3620;
  std::__cxx11::string::string((string *)&this->host_);
  std::__cxx11::string::string((string *)&this->username_);
  std::__cxx11::string::string((string *)&this->password_);
  std::__cxx11::string::string((string *)&this->default_account_);
  std::__cxx11::string::string((string *)&this->application_);
  std::__cxx11::string::string((string *)&this->application_version_);
  std::__cxx11::string::string((string *)&this->product_serial_number_);
  this_00 = (PricingSession *)operator_new(0xa8);
  price::PricingSession::PricingSession(this_00,(UserInfo *)this);
  local_70 = (Pricing *)0x0;
  if (this_00 != (PricingSession *)0x0) {
    local_70 = &this_00->super_Pricing;
  }
  this->pricing_ = local_70;
  return;
}

Assistant:

ApiSession::ApiSession()
{
    pricing_ = new PricingSession((BasicUserInfo*) this);
}